

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O3

string * __thiscall
wabt::string_view::to_string_abi_cxx11_(string *__return_storage_ptr__,string_view *this)

{
  char *pcVar1;
  size_type sVar2;
  
  pcVar1 = this->data_;
  sVar2 = this->size_;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string string_view::to_string() const {
  return std::string(data_, size_);
}